

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_convertable.c
# Opt level: O0

int mpt_print_convertable
              (mpt_convertable *conv,_func_ssize_t_void_ptr_char_ptr_size_t *save,void *dest)

{
  ssize_t sVar1;
  undefined1 local_158 [4];
  int ret;
  uint8_t buf [256];
  undefined1 local_50 [8];
  mpt_value val;
  char *pcStack_38;
  int type;
  iovec vec;
  void *dest_local;
  _func_ssize_t_void_ptr_char_ptr_size_t *save_local;
  mpt_convertable *conv_local;
  
  vec.iov_len = (size_t)dest;
  val._type._4_4_ = (*conv->_vptr->convert)(conv,0x43,&stack0xffffffffffffffc8);
  if (val._type._4_4_ < 0) {
    val._type._4_4_ = (*conv->_vptr->convert)(conv,0,(void *)0x0);
    conv_local._4_4_ = val._type._4_4_;
    if (-1 < val._type._4_4_) {
      if (val._type._4_4_ < 0x80) {
        conv_local._4_4_ = (*conv->_vptr->convert)(conv,(long)val._type._4_4_,local_158);
        if (-1 < conv_local._4_4_) {
          local_50 = (undefined1  [8])local_158;
          val._addr = (void *)(long)val._type._4_4_;
          conv_local._4_4_ = mpt_print_value((mpt_value *)local_50,save,(void *)vec.iov_len);
        }
      }
      else {
        conv_local._4_4_ = -3;
      }
    }
  }
  else {
    sVar1 = (*save)((void *)vec.iov_len,pcStack_38,(size_t)vec.iov_base);
    conv_local._4_4_ = (int)sVar1;
  }
  return conv_local._4_4_;
}

Assistant:

extern int mpt_print_convertable(MPT_INTERFACE(convertable) *conv, ssize_t (*save)(void *, const char *, size_t), void *dest)
{
	struct iovec vec;
	int type;
	
	/* only default namespace is supported */
	if ((type = conv->_vptr->convert(conv, MPT_type_toVector('c'), &vec)) >= 0) {
		return save(dest, vec.iov_base, vec.iov_len);
	}
	/* get default type of convertable */
	if ((type = conv->_vptr->convert(conv, 0, 0)) < 0) {
		return type;
	}
	/* only core value types are supported */
	if (type < MPT_ENUM(TypeConvertablePtr)) {
		MPT_STRUCT(value) val;
		uint8_t buf[256];
		int ret;
		/* copy data to buffer */
		if ((ret = conv->_vptr->convert(conv, type, buf)) < 0) {
			return ret;
		}
		MPT_value_set(&val, type, buf);
		return mpt_print_value(&val, save, dest);
	}
	return MPT_ERROR(BadType);
}